

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast.h
# Opt level: O3

bool __thiscall
pybind11::detail::
argument_loader<pybind11::detail::value_and_holder&,Eigen::Ref<Eigen::Matrix<double,-1,3,1,-1,3>const,0,Eigen::OuterStride<-1>>&,Eigen::Ref<Eigen::Matrix<long,-1,3,1,-1,3>const,0,Eigen::OuterStride<-1>>&>
::load_impl_sequence<0ul,1ul,2ul>
          (argument_loader<pybind11::detail::value_and_holder&,Eigen::Ref<Eigen::Matrix<double,_1,3,1,_1,3>const,0,Eigen::OuterStride<_1>>&,Eigen::Ref<Eigen::Matrix<long,_1,3,1,_1,3>const,0,Eigen::OuterStride<_1>>&>
           *this,long call)

{
  uint uVar1;
  undefined8 *puVar2;
  long lVar3;
  bool bVar4;
  char local_13 [3];
  
  puVar2 = *(undefined8 **)(call + 8);
  uVar1 = **(uint **)(call + 0x20);
  *(undefined8 *)(this + 0x30) = *puVar2;
  type_caster<Eigen::Ref<const_Eigen::Matrix<double,_-1,_3,_1,_-1,_3>,_0,_Eigen::OuterStride<-1>_>,_void>
  ::load((type_caster<Eigen::Ref<const_Eigen::Matrix<double,__1,_3,_1,__1,_3>,_0,_Eigen::OuterStride<_1>_>,_void>
          *)(this + 0x18),(PyObject *)puVar2[1],SUB41((uVar1 & 2) >> 1,0));
  type_caster<Eigen::Ref<const_Eigen::Matrix<long,_-1,_3,_1,_-1,_3>,_0,_Eigen::OuterStride<-1>_>,_void>
  ::load((type_caster<Eigen::Ref<const_Eigen::Matrix<long,__1,_3,_1,__1,_3>,_0,_Eigen::OuterStride<_1>_>,_void>
          *)this,*(PyObject **)(*(long *)(call + 8) + 0x10),
         SUB41((**(uint **)(call + 0x20) & 4) >> 2,0));
  lVar3 = 0;
  do {
    if (local_13[lVar3] != '\x01') {
      return (bool)local_13[lVar3];
    }
    bVar4 = lVar3 != 2;
    lVar3 = lVar3 + 1;
  } while (bVar4);
  return true;
}

Assistant:

bool load_impl_sequence(function_call &call, index_sequence<Is...>) {
        for (bool r : {std::get<Is>(argcasters).load(call.args[Is], call.args_convert[Is])...})
            if (!r)
                return false;
        return true;
    }